

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

SQInteger __thiscall SQFuncState::PushLocalVariable(SQFuncState *this,SQObject *name)

{
  SQUnsignedInteger *pSVar1;
  ulong uVar2;
  ulong uVar3;
  SQLocalVarInfo *pSVar4;
  ulong uVar5;
  SQUnsignedInteger SVar6;
  SQObjectPtr local_40;
  SQUnsignedInteger local_30;
  SQUnsignedInteger SStack_28;
  ulong local_20;
  
  uVar2 = (this->_vlocals)._size;
  SStack_28 = 0;
  local_40.super_SQObject._unVal = (SQObjectValue)(name->_unVal).pTable;
  local_40.super_SQObject._type = name->_type;
  if ((local_40.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  local_30 = (this->_instructions)._size;
  pSVar4 = (this->_vlocals)._vals;
  uVar3 = (this->_vlocals)._allocated;
  uVar5 = uVar2;
  local_20 = uVar2;
  if (uVar3 <= uVar2) {
    SVar6 = 4;
    if (uVar2 * 2 != 0) {
      SVar6 = uVar2 * 2;
    }
    pSVar4 = (SQLocalVarInfo *)sq_vm_realloc(pSVar4,uVar3 * 0x28,SVar6 * 0x28);
    (this->_vlocals)._vals = pSVar4;
    (this->_vlocals)._allocated = SVar6;
    uVar5 = (this->_vlocals)._size;
  }
  (this->_vlocals)._size = uVar5 + 1;
  pSVar4 = pSVar4 + uVar5;
  (pSVar4->_name).super_SQObject._type = OT_NULL;
  (pSVar4->_name).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (pSVar4->_name).super_SQObject._unVal.pTable = (SQTable *)local_40.super_SQObject._unVal;
  (pSVar4->_name).super_SQObject._type = local_40.super_SQObject._type;
  if ((local_40.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  pSVar4->_start_op = local_30;
  pSVar4->_end_op = SStack_28;
  pSVar4->_pos = local_20;
  uVar3 = (this->_vlocals)._size;
  if ((ulong)this->_stacksize < uVar3) {
    this->_stacksize = uVar3;
  }
  SQObjectPtr::~SQObjectPtr(&local_40);
  return uVar2;
}

Assistant:

SQInteger SQFuncState::PushLocalVariable(const SQObject &name)
{
    SQInteger pos=_vlocals.size();
    SQLocalVarInfo lvi;
    lvi._name=name;
    lvi._start_op=GetCurrentPos()+1;
    lvi._pos=_vlocals.size();
    _vlocals.push_back(lvi);
    if(_vlocals.size()>((SQUnsignedInteger)_stacksize))_stacksize=_vlocals.size();
    return pos;
}